

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

void __thiscall ymfm::opll_registers::opll_registers(opll_registers *this)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint16_t local_36;
  uint local_24;
  uint local_20;
  uint32_t opoffs;
  uint32_t choffs;
  uint32_t index_1;
  uint16_t zeroval;
  uint32_t index;
  opll_registers *this_local;
  
  this->m_lfo_am_counter = 0;
  this->m_lfo_pm_counter = 0;
  this->m_noise_lfsr = 1;
  this->m_lfo_am = '\0';
  for (index_1 = 0; index_1 < 0x400; index_1 = index_1 + 1) {
    uVar2 = abs_sin_attenuation(index_1);
    uVar3 = bitfield(index_1,9,1);
    this->m_waveform[0][index_1] = (ushort)uVar2 | (ushort)(uVar3 << 0xf);
  }
  uVar1 = this->m_waveform[0][0];
  for (opoffs = 0; opoffs < 0x400; opoffs = opoffs + 1) {
    uVar2 = bitfield(opoffs,9,1);
    local_36 = uVar1;
    if (uVar2 == 0) {
      local_36 = this->m_waveform[0][opoffs];
    }
    this->m_waveform[1][opoffs] = local_36;
  }
  for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
    this->m_chinst[local_20] = this->m_regdata;
  }
  for (local_24 = 0; local_24 < 0x12; local_24 = local_24 + 1) {
    uVar2 = bitfield(local_24,0,1);
    this->m_opinst[local_24] = this->m_regdata + uVar2;
  }
  return;
}

Assistant:

opll_registers::opll_registers() :
	m_lfo_am_counter(0),
	m_lfo_pm_counter(0),
	m_noise_lfsr(1),
	m_lfo_am(0)
{
	// create the waveforms
	for (uint32_t index = 0; index < WAVEFORM_LENGTH; index++)
		m_waveform[0][index] = abs_sin_attenuation(index) | (bitfield(index, 9) << 15);

	uint16_t zeroval = m_waveform[0][0];
	for (uint32_t index = 0; index < WAVEFORM_LENGTH; index++)
		m_waveform[1][index] = bitfield(index, 9) ? zeroval : m_waveform[0][index];

	// initialize the instruments to something sane
	for (uint32_t choffs = 0; choffs < CHANNELS; choffs++)
		m_chinst[choffs] = &m_regdata[0];
	for (uint32_t opoffs = 0; opoffs < OPERATORS; opoffs++)
		m_opinst[opoffs] = &m_regdata[bitfield(opoffs, 0)];
}